

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O3

bool sptk::ReadStream<unsigned_long>
               (bool zero_padding,int stream_skip,int read_point,int read_size,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *sequence_to_read,
               istream *input_stream,int *actual_read_size)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong __new_size;
  uint uVar4;
  int iVar5;
  double dVar6;
  
  if ((((input_stream != (istream *)0x0 &&
        sequence_to_read != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) &&
        (0 < read_size && -1 < (read_point | stream_skip))) &&
      (((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 2) == 0)) &&
     ((stream_skip < 1 ||
      (std::istream::ignore((long)input_stream),
      ((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 2) == 0)))) {
    __new_size = (ulong)(uint)(read_size + read_point);
    lVar3 = *(long *)sequence_to_read;
    if ((ulong)(*(long *)(sequence_to_read + 8) - lVar3 >> 3) < __new_size) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (sequence_to_read,__new_size);
      lVar3 = *(long *)sequence_to_read;
    }
    std::istream::read((char *)input_stream,lVar3 + (ulong)(uint)read_point * 8);
    iVar1 = *(int *)(input_stream + 8);
    if (actual_read_size != (int *)0x0) {
      iVar5 = iVar1 + 7;
      if (-1 < iVar1) {
        iVar5 = iVar1;
      }
      *actual_read_size = iVar5 >> 3;
    }
    uVar4 = 5;
    iVar5 = read_size * 8 - iVar1;
    if (iVar5 == 0) {
LAB_00105de0:
      return (*(uint *)(input_stream + *(long *)(*(long *)input_stream + -0x18) + 0x20) & uVar4) ==
             0;
    }
    if (zero_padding && 0 < iVar1) {
      dVar6 = ceil((double)iVar5 * 0.125);
      uVar2 = (uint)dVar6;
      if (-1 < (int)uVar2) {
        uVar4 = 1;
        if (uVar2 != 0) {
          memset((void *)(__new_size * 8 + *(long *)sequence_to_read + (ulong)uVar2 * -8),0,
                 (ulong)uVar2 * 8);
        }
        goto LAB_00105de0;
      }
    }
  }
  return false;
}

Assistant:

bool ReadStream(bool zero_padding, int stream_skip, int read_point,
                int read_size, std::vector<T>* sequence_to_read,
                std::istream* input_stream, int* actual_read_size) {
  if (stream_skip < 0 || read_point < 0 || read_size <= 0 ||
      NULL == sequence_to_read || NULL == input_stream || input_stream->eof()) {
    return false;
  }

  const int type_byte(sizeof((*sequence_to_read)[0]));

  if (0 < stream_skip) {
    input_stream->ignore(type_byte * stream_skip);
    if (input_stream->eof()) return false;
  }

  const int end(read_point + read_size);
  if (sequence_to_read->size() < static_cast<std::size_t>(end)) {
    sequence_to_read->resize(end);
  }

  const int num_read_bytes(type_byte * read_size);
  input_stream->read(
      reinterpret_cast<char*>(&((*sequence_to_read)[0]) + read_point),
      num_read_bytes);

  const int gcount(static_cast<int>(input_stream->gcount()));
  if (NULL != actual_read_size) {
    *actual_read_size = gcount / type_byte;
  }

  if (num_read_bytes == gcount) {
    return !input_stream->fail();
  } else if (zero_padding && 0 < gcount) {
    // Use std::ceil to zero incomplete data
    // as gcount may not be a multiple of sizeof(double).
    const int num_zeros(static_cast<int>(
        std::ceil(static_cast<double>(num_read_bytes - gcount) / type_byte)));
    if (num_zeros < 0) {
      return false;  // Something wrong!
    }

    std::fill_n(sequence_to_read->begin() + end - num_zeros, num_zeros,
                static_cast<T>(0));

    return !input_stream->bad();
  }

  return false;
}